

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
HasNoNewUnconfirmed_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransaction *tx,CTxMemPool *pool,setEntries *iters_conflicting)

{
  long lVar1;
  uint256 *puVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  size_type sVar7;
  uint uVar8;
  CTxIn *txin;
  uchar *puVar9;
  ulong uVar10;
  uint *in_R8;
  long in_FS_OFFSET;
  undefined1 local_b4 [4];
  string local_b0;
  GenTxid local_90;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> parents_of_conflicts;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_header;
  parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parents_of_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = (iters_conflicting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(iters_conflicting->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    puVar2 = (uint256 *)((undefined8 *)**(long **)(p_Var6 + 1))[1];
    for (puVar9 = *(uchar **)**(long **)(p_Var6 + 1); (uint256 *)puVar9 != puVar2;
        puVar9 = puVar9 + 0x68) {
      std::
      _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
      _M_insert_unique<uint256_const&>
                ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                  *)&parents_of_conflicts,(uint256 *)puVar9);
    }
  }
  uVar8 = 0;
  do {
    uVar10 = (ulong)uVar8;
    pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b4 = (undefined1  [4])uVar8;
    if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar3) / 0x68) <= uVar10) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
LAB_002595d0:
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&parents_of_conflicts._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    sVar7 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                      (&parents_of_conflicts,(key_type *)(pCVar3 + uVar10));
    if (sVar7 == 0) {
      pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_90.m_is_wtxid = false;
      pCVar3 = pCVar4 + uVar10;
      local_90.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)&(pCVar3->prevout).hash;
      local_90.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((long)&(pCVar3->prevout).hash + 8);
      puVar9 = (uchar *)((long)&pCVar4[uVar10].prevout.hash + 0x10);
      local_90.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar9;
      local_90.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar9 + 8);
      bVar5 = CTxMemPool::exists(pool,&local_90);
      if (bVar5) {
        base_blob<256u>::ToString_abi_cxx11_((string *)(local_b4 + 4),(base_blob<256u> *)&tx->hash);
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  ((string *)&local_90,(tinyformat *)"replacement %s adds unconfirmed input, idx %d"
                   ,local_b4 + 4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b4,
                   in_R8);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)(local_b4 + 4));
        goto LAB_002595d0;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

std::optional<std::string> HasNoNewUnconfirmed(const CTransaction& tx,
                                               const CTxMemPool& pool,
                                               const CTxMemPool::setEntries& iters_conflicting)
{
    AssertLockHeld(pool.cs);
    std::set<uint256> parents_of_conflicts;
    for (const auto& mi : iters_conflicting) {
        for (const CTxIn& txin : mi->GetTx().vin) {
            parents_of_conflicts.insert(txin.prevout.hash);
        }
    }

    for (unsigned int j = 0; j < tx.vin.size(); j++) {
        // Rule #2: We don't want to accept replacements that require low feerate junk to be
        // mined first.  Ideally we'd keep track of the ancestor feerates and make the decision
        // based on that, but for now requiring all new inputs to be confirmed works.
        //
        // Note that if you relax this to make RBF a little more useful, this may break the
        // CalculateMempoolAncestors RBF relaxation which subtracts the conflict count/size from the
        // descendant limit.
        if (!parents_of_conflicts.count(tx.vin[j].prevout.hash)) {
            // Rather than check the UTXO set - potentially expensive - it's cheaper to just check
            // if the new input refers to a tx that's in the mempool.
            if (pool.exists(GenTxid::Txid(tx.vin[j].prevout.hash))) {
                return strprintf("replacement %s adds unconfirmed input, idx %d",
                                 tx.GetHash().ToString(), j);
            }
        }
    }
    return std::nullopt;
}